

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp3_fast_moreThen5(word *pInOut,int iVar,int start,int finish,int iQ,int jQ,int *pDifStart)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  bVar2 = (char)iVar - 6;
  uVar4 = 1 << (bVar2 & 0x1f);
  iVar3 = start + -1;
  iVar1 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  do {
    if (iVar3 < finish) {
      iVar3 = 0;
LAB_0046efd7:
      *pDifStart = iVar3;
      return iVar1;
    }
    for (lVar5 = 0; -lVar5 != (ulong)uVar4; lVar5 = lVar5 + -1) {
      iVar6 = -(uint)(pInOut[(iVar3 + lVar5) - (long)(iQ << (bVar2 & 0x1f))] <
                     pInOut[(iVar3 + lVar5) - (long)(jQ << (bVar2 & 0x1f))]);
      if (pInOut[(iVar3 + lVar5) - (long)(jQ << (bVar2 & 0x1f))] <
          pInOut[(iVar3 + lVar5) - (long)(iQ << (bVar2 & 0x1f))]) {
        iVar6 = 1;
      }
      if (iVar6 != 0) {
        iVar3 = iVar3 + 1;
        iVar1 = 0;
        if (iVar6 != -1) {
          iVar1 = 1;
        }
        goto LAB_0046efd7;
      }
    }
    iVar3 = iVar3 + (-4 << (bVar2 & 0x1f));
  } while( true );
}

Assistant:

int minTemp3_fast_moreThen5(word* pInOut, int iVar, int start, int finish, int iQ, int jQ, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp3_fast_moreThen5\n");

    for(i=start-1; i>=finish; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j-iQ*wordBlock],pInOut[i-j-jQ*wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 1;
            }
        }
    *pDifStart=0;
//    printf("out minTemp3_fast_moreThen5\n");

    return 0;
}